

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

size_t fio_poll(void)

{
  fio_defer_task_s task;
  fio_defer_task_s task_00;
  int iVar1;
  int iVar2;
  size_t sVar3;
  int local_34c;
  int i;
  int active_count;
  int j;
  int internal_count;
  int total;
  epoll_event events [64];
  epoll_event internal [2];
  size_t sStack_10;
  int timeout_millisec;
  
  sVar3 = fio_timer_calc_first_interval();
  j = 0;
  iVar1 = epoll_wait(evio_fd[0],(epoll_event *)&events[0x3f].data,2,(int)sVar3);
  if (iVar1 == 0) {
    j = 0;
  }
  else {
    for (i = 0; i < iVar1; i = i + 1) {
      iVar2 = epoll_wait(*(int *)((long)&events[(long)i + 0x3f].data + 4),
                         (epoll_event *)&internal_count,0x40,0);
      if (0 < iVar2) {
        for (local_34c = 0; local_34c < iVar2; local_34c = local_34c + 1) {
          if (((&internal_count)[(long)local_34c * 3] & 0xfffffffaU) == 0) {
            if (((&internal_count)[(long)local_34c * 3] & 4U) != 0) {
              task.arg1 = (void *)(long)CONCAT41(*(undefined4 *)
                                                  ((long)&events[(long)local_34c + -1].data + 4),
                                                 *(undefined1 *)
                                                  ((long)fio_data +
                                                  (long)*(int *)((long)&events[(long)local_34c + -1]
                                                                        .data + 4) * 0xa8 + 0x6d));
              task.func = deferred_on_ready;
              task.arg2 = (void *)0x0;
              fio_defer_push_task_fn(task,&task_queue_urgent);
            }
            if (((&internal_count)[(long)local_34c * 3] & 1U) != 0) {
              task_00.arg1 = (void *)(long)CONCAT41(*(undefined4 *)
                                                     ((long)&events[(long)local_34c + -1].data + 4),
                                                    *(undefined1 *)
                                                     ((long)fio_data +
                                                     (long)*(int *)((long)&events[(long)local_34c +
                                                                                  -1].data + 4) *
                                                     0xa8 + 0x6d));
              task_00.func = deferred_on_data;
              task_00.arg2 = (void *)0x0;
              fio_defer_push_task_fn(task_00,&task_queue_normal);
              fio_defer_thread_signal();
            }
          }
          else {
            fio_force_close_in_poll
                      ((long)CONCAT41(*(undefined4 *)((long)&events[(long)local_34c + -1].data + 4),
                                      *(undefined1 *)
                                       ((long)fio_data +
                                       (long)*(int *)((long)&events[(long)local_34c + -1].data + 4)
                                       * 0xa8 + 0x6d)));
          }
        }
        j = iVar2 + j;
      }
    }
  }
  sStack_10 = (size_t)j;
  return sStack_10;
}

Assistant:

static size_t fio_poll(void) {
  int timeout_millisec = fio_timer_calc_first_interval();
  struct epoll_event internal[2];
  struct epoll_event events[FIO_POLL_MAX_EVENTS];
  int total = 0;
  /* wait for events and handle them */
  int internal_count = epoll_wait(evio_fd[0], internal, 2, timeout_millisec);
  if (internal_count == 0)
    return internal_count;
  for (int j = 0; j < internal_count; ++j) {
    int active_count =
        epoll_wait(internal[j].data.fd, events, FIO_POLL_MAX_EVENTS, 0);
    if (active_count > 0) {
      for (int i = 0; i < active_count; i++) {
        if (events[i].events & (~(EPOLLIN | EPOLLOUT))) {
          // errors are hendled as disconnections (on_close)
          fio_force_close_in_poll(fd2uuid(events[i].data.fd));
        } else {
          // no error, then it's an active event(s)
          if (events[i].events & EPOLLOUT) {
            fio_defer_push_urgent(deferred_on_ready,
                                  (void *)fd2uuid(events[i].data.fd), NULL);
          }
          if (events[i].events & EPOLLIN)
            fio_defer_push_task(deferred_on_data,
                                (void *)fd2uuid(events[i].data.fd), NULL);
        }
      } // end for loop
      total += active_count;
    }
  }
  return total;
}